

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceBundle *
ures_getByKeyWithFallback_63
          (UResourceBundle *resB,char *inKey,UResourceBundle *fillIn,UErrorCode *status)

{
  char *__s1;
  UBool UVar1;
  int iVar2;
  char *__s2;
  bool bVar3;
  StringPiece s;
  undefined1 local_d0 [3] [12];
  int32_t local_ac;
  char *pcStack_a8;
  int32_t len;
  char *resPath;
  char *myPath;
  CharString path;
  UResourceDataEntry *dataEntry;
  char *key;
  UResourceBundle *pUStack_40;
  int32_t type;
  UResourceBundle *helper;
  Resource rootRes;
  Resource res;
  UErrorCode *status_local;
  UResourceBundle *fillIn_local;
  char *inKey_local;
  UResourceBundle *resB_local;
  
  helper._4_4_ = 0xffffffff;
  helper._0_4_ = 0xffffffff;
  pUStack_40 = (UResourceBundle *)0x0;
  status_local = (UErrorCode *)fillIn;
  if ((status == (UErrorCode *)0x0) ||
     (_rootRes = status, fillIn_local = (UResourceBundle *)inKey, inKey_local = (char *)resB,
     UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    resB_local = (UResourceBundle *)status_local;
  }
  else if (inKey_local == (char *)0x0) {
    *_rootRes = U_ILLEGAL_ARGUMENT_ERROR;
    resB_local = (UResourceBundle *)status_local;
  }
  else {
    key._4_4_ = *(uint *)(inKey_local + 0xac) >> 0x1c;
    if (((key._4_4_ == 2) || (key._4_4_ == 5)) || (key._4_4_ == 4)) {
      helper._4_4_ = getTableItemByKeyPath
                               ((ResourceData *)(inKey_local + 0x28),
                                *(Resource *)(inKey_local + 0xac),(char *)fillIn_local);
      dataEntry = (UResourceDataEntry *)fillIn_local;
      if (helper._4_4_ == 0xffffffff) {
        path._56_8_ = *(undefined8 *)(inKey_local + 8);
        icu_63::CharString::CharString((CharString *)&myPath);
        resPath = (char *)0x0;
        pcStack_a8 = *(char **)(inKey_local + 0x20);
        local_ac = *(int32_t *)(inKey_local + 0xa8);
LAB_003d589a:
        bVar3 = false;
        if (helper._4_4_ == 0xffffffff) {
          bVar3 = *(long *)(path._56_8_ + 0x10) != 0;
        }
        if (bVar3) {
          path._56_8_ = *(long *)(path._56_8_ + 0x10);
          helper._0_4_ = *(Resource *)(path._56_8_ + 0x48);
          if (*(int *)(path._56_8_ + 0x70) == 0) {
            icu_63::CharString::clear((CharString *)&myPath);
            if (0 < local_ac) {
              icu_63::CharString::append((CharString *)&myPath,pcStack_a8,local_ac,_rootRes);
            }
            icu_63::StringPiece::StringPiece((StringPiece *)local_d0,(char *)fillIn_local);
            s._12_4_ = 0;
            s.ptr_ = (char *)local_d0[0]._0_8_;
            s.length_ = local_d0[0]._8_4_;
            icu_63::CharString::append((CharString *)&myPath,s,_rootRes);
            UVar1 = U_FAILURE(*_rootRes);
            if (UVar1 != '\0') {
              ures_close_63(pUStack_40);
              resB_local = (UResourceBundle *)status_local;
              bVar3 = true;
              goto LAB_003d5ba8;
            }
            resPath = icu_63::CharString::data((CharString *)&myPath);
            dataEntry = (UResourceDataEntry *)fillIn_local;
            do {
              helper._4_4_ = res_findResource_63((ResourceData *)(path._56_8_ + 0x28),
                                                 (Resource)helper,&resPath,(char **)&dataEntry);
              if ((helper._4_4_ >> 0x1c == 3) && (*resPath != '\0')) {
                pUStack_40 = init_resb_result((ResourceData *)(path._56_8_ + 0x28),helper._4_4_,
                                              (char *)0x0,-1,(UResourceDataEntry *)path._56_8_,
                                              (UResourceBundle *)inKey_local,0,pUStack_40,_rootRes);
                if (pUStack_40 == (UResourceBundle *)0x0) break;
                path._56_8_ = pUStack_40->fData;
                helper._0_4_ = pUStack_40->fRes;
                pcStack_a8 = pUStack_40->fResPath;
                local_ac = pUStack_40->fResPathLen;
              }
            } while (*resPath != '\0');
          }
          goto LAB_003d589a;
        }
        if (helper._4_4_ == 0xffffffff) {
          *_rootRes = U_MISSING_RESOURCE_ERROR;
        }
        else {
          __s1 = *(char **)path._56_8_;
          __s2 = uloc_getDefault_63();
          iVar2 = strcmp(__s1,__s2);
          if ((iVar2 == 0) || (iVar2 = strcmp(*(char **)path._56_8_,"root"), iVar2 == 0)) {
            *_rootRes = U_USING_DEFAULT_WARNING;
          }
          else {
            *_rootRes = U_ERROR_WARNING_START;
          }
          status_local = (UErrorCode *)
                         init_resb_result((ResourceData *)(path._56_8_ + 0x28),helper._4_4_,
                                          (char *)fillIn_local,-1,(UResourceDataEntry *)path._56_8_,
                                          (UResourceBundle *)inKey_local,0,
                                          (UResourceBundle *)status_local,_rootRes);
        }
        bVar3 = false;
LAB_003d5ba8:
        icu_63::CharString::~CharString((CharString *)&myPath);
        if (bVar3) {
          return resB_local;
        }
      }
      else {
        status_local = (UErrorCode *)
                       init_resb_result((ResourceData *)(inKey_local + 0x28),helper._4_4_,
                                        (char *)fillIn_local,-1,
                                        *(UResourceDataEntry **)(inKey_local + 8),
                                        (UResourceBundle *)inKey_local,0,
                                        (UResourceBundle *)status_local,_rootRes);
      }
    }
    else {
      *_rootRes = U_RESOURCE_TYPE_MISMATCH;
    }
    ures_close_63(pUStack_40);
    resB_local = (UResourceBundle *)status_local;
  }
  return resB_local;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2 
ures_getByKeyWithFallback(const UResourceBundle *resB, 
                          const char* inKey, 
                          UResourceBundle *fillIn, 
                          UErrorCode *status) {
    Resource res = RES_BOGUS, rootRes = RES_BOGUS;
    /*UResourceDataEntry *realData = NULL;*/
    UResourceBundle *helper = NULL;

    if (status==NULL || U_FAILURE(*status)) {
        return fillIn;
    }
    if(resB == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return fillIn;
    }

    int32_t type = RES_GET_TYPE(resB->fRes);
    if(URES_IS_TABLE(type)) {
        res = getTableItemByKeyPath(&(resB->fResData), resB->fRes, inKey);
        const char* key = inKey;
        if(res == RES_BOGUS) {
            UResourceDataEntry *dataEntry = resB->fData;
            CharString path;
            char *myPath = NULL;
            const char* resPath = resB->fResPath;
            int32_t len = resB->fResPathLen;
            while(res == RES_BOGUS && dataEntry->fParent != NULL) { /* Otherwise, we'll look in parents */
                dataEntry = dataEntry->fParent;
                rootRes = dataEntry->fData.rootRes;

                if(dataEntry->fBogus == U_ZERO_ERROR) {
                    path.clear();
                    if (len > 0) {
                        path.append(resPath, len, *status);
                    }
                    path.append(inKey, *status);
                    if (U_FAILURE(*status)) {
                        ures_close(helper);
                        return fillIn;
                    }
                    myPath = path.data();
                    key = inKey;
                    do {
                        res = res_findResource(&(dataEntry->fData), rootRes, &myPath, &key);
                        if (RES_GET_TYPE(res) == URES_ALIAS && *myPath) {
                            /* We hit an alias, but we didn't finish following the path. */
                            helper = init_resb_result(&(dataEntry->fData), res, NULL, -1, dataEntry, resB, 0, helper, status); 
                            /*helper = init_resb_result(&(dataEntry->fData), res, inKey, -1, dataEntry, resB, 0, helper, status);*/
                            if(helper) {
                              dataEntry = helper->fData;
                              rootRes = helper->fRes;
                              resPath = helper->fResPath;
                              len = helper->fResPathLen;

                            } else {
                              break;
                            }
                        }
                    } while(*myPath); /* Continue until the whole path is consumed */
                }
            }
            /*const ResourceData *rd = getFallbackData(resB, &key, &realData, &res, status);*/
            if(res != RES_BOGUS) {
              /* check if resB->fResPath gives the right name here */
                if(uprv_strcmp(dataEntry->fName, uloc_getDefault())==0 || uprv_strcmp(dataEntry->fName, kRootLocaleName)==0) {
                    *status = U_USING_DEFAULT_WARNING;
                } else {
                    *status = U_USING_FALLBACK_WARNING;
                }

                fillIn = init_resb_result(&(dataEntry->fData), res, inKey, -1, dataEntry, resB, 0, fillIn, status);
            } else {
                *status = U_MISSING_RESOURCE_ERROR;
            }
        } else {
            fillIn = init_resb_result(&(resB->fResData), res, key, -1, resB->fData, resB, 0, fillIn, status);
        }
    } 
    else {
        *status = U_RESOURCE_TYPE_MISMATCH;
    }
    ures_close(helper);
    return fillIn;
}